

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O1

Memslot __thiscall bsplib::Rdma::lookup_reg(Rdma *this,void *addr,bool pushed,bool popped)

{
  uint uVar1;
  Memslot MVar2;
  pointer pMVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  long lVar9;
  ulong uVar10;
  _Hash_node_base *p_Var11;
  _Hash_node_base *p_Var12;
  _Hash_node_base *unaff_RBX;
  bool bVar13;
  __node_base_ptr p_Var14;
  
  if (addr == (void *)0x0) {
    return 0xfffffffffffffffe;
  }
  MVar2 = this->m_cached_slot;
  if (MVar2 != 0xffffffffffffffff) {
    lVar9 = (long)this->m_nprocs * MVar2;
    pMVar3 = (this->m_used_slots).
             super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pMVar3[lVar9 + this->m_pid].addr == addr) && (pMVar3[lVar9 + this->m_pid].status == 0)) {
      return MVar2;
    }
  }
  uVar4 = (this->m_register)._M_h._M_bucket_count;
  uVar10 = (ulong)addr % uVar4;
  p_Var5 = (this->m_register)._M_h._M_buckets[uVar10];
  p_Var14 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (unaff_RBX = p_Var5->_M_nxt, p_Var14 = p_Var5, unaff_RBX[1]._M_nxt != (_Hash_node_base *)addr))
  {
    while (p_Var11 = unaff_RBX, unaff_RBX = p_Var11->_M_nxt, unaff_RBX != (_Hash_node_base *)0x0) {
      p_Var14 = (__node_base_ptr)0x0;
      if (((ulong)unaff_RBX[1]._M_nxt % uVar4 != uVar10) ||
         (p_Var14 = p_Var11, unaff_RBX[1]._M_nxt == (_Hash_node_base *)addr)) goto LAB_001080f8;
    }
    p_Var14 = (__node_base_ptr)0x0;
  }
LAB_001080f8:
  if (p_Var14 == (__node_base_ptr)0x0) {
    p_Var11 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var11 = p_Var14->_M_nxt;
  }
  if (p_Var11 != (_Hash_node_base *)0x0) {
    p_Var6 = p_Var11[2]._M_nxt;
    pMVar3 = (this->m_used_slots).
             super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    p_Var11 = p_Var11 + 2;
    do {
      p_Var12 = p_Var11;
      p_Var8 = unaff_RBX;
      if (p_Var12 == p_Var6) break;
      p_Var11 = p_Var12[1]._M_nxt;
      p_Var7 = p_Var11[2]._M_nxt;
      uVar1 = pMVar3[(long)this->m_pid + (long)p_Var7 * (long)this->m_nprocs].status;
      if (uVar1 == 0) {
        this->m_cached_slot = (Memslot)p_Var7;
        bVar13 = false;
        p_Var8 = p_Var7;
      }
      else {
        bVar13 = true;
        if (((bool)((byte)uVar1 & 1) == pushed) &&
           (bVar13 = ((uVar1 & 2) == 0) == popped, p_Var8 = p_Var7, bVar13)) {
          p_Var8 = unaff_RBX;
        }
      }
      unaff_RBX = p_Var8;
    } while (bVar13);
    if (p_Var12 != p_Var6) {
      return (Memslot)p_Var8;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

Memslot lookup_reg( const void * addr, bool pushed, bool popped ) const
    {   
        if (addr == NULL ) return null_slot();
        
        if ( m_cached_slot != no_slot() 
                && slot( m_pid, m_cached_slot).addr == addr
                && slot( m_pid, m_cached_slot).status == Memblock::NORMAL )
            return m_cached_slot;

        Reg::const_iterator i = m_register.find( const_cast<void*>(addr) );
        if (i != m_register.end()) {
            for (RRSIt j = i->second.rbegin(); j != i->second.rend(); ++j) {
                unsigned status  = slot( m_pid, *j ).status ;
                if ( status == unsigned(Memblock::NORMAL))  {
                    m_cached_slot = *j;
                    return m_cached_slot;
                }
                if ( pushed == bool (status & Memblock::PUSHED)
                  &&  popped == bool (status & Memblock::POPPED)) {
                    return *j;
                }
                             
            }
        }
        return no_slot(); 
    }